

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O0

bool slang::ast::ValueExpressionBase::checkVariableAssignment
               (ASTContext *context,VariableSymbol *var,bitmask<slang::ast::AssignFlags> flags,
               SourceLocation assignLoc,SourceRange varRange)

{
  DiagCode code;
  DiagCode code_00;
  DiagCode code_01;
  DiagCode code_02;
  DiagCode code_03;
  DiagCode code_04;
  DiagCode code_05;
  bool bVar1;
  Scope *this;
  Expression *pEVar2;
  int *in_RSI;
  ClockVarSymbol *cv;
  Scope *parentScope;
  Symbol *parent;
  anon_class_32_4_231050bc reportErr;
  undefined6 in_stack_ffffffffffffff28;
  underlying_type in_stack_ffffffffffffff2e;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  undefined1 uVar3;
  bitmask<slang::ast::MethodFlags> *in_stack_ffffffffffffff38;
  byte local_b9;
  bool local_a9;
  bitmask<slang::ast::AssignFlags> local_9b;
  undefined4 local_9a;
  bitmask<slang::ast::AssignFlags> local_95;
  undefined4 local_94;
  ClockVarSymbol *local_90;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  bitmask<slang::ast::AssignFlags> local_7f;
  undefined2 local_7e;
  DiagSubsystem in_stack_ffffffffffffff84;
  uint16_t in_stack_ffffffffffffff86;
  bitmask<slang::ast::AssignFlags> local_73;
  bitmask<slang::ast::VariableFlags> local_72;
  undefined4 local_70;
  bitmask<slang::ast::MethodFlags> local_6c;
  underlying_type local_6a;
  Scope *local_68;
  Symbol *local_60;
  bitmask<slang::ast::VariableFlags> local_52;
  undefined1 *local_50;
  undefined1 *local_48;
  int *local_30;
  undefined1 local_20 [16];
  undefined1 local_10 [15];
  bool local_1;
  
  local_50 = local_10;
  local_48 = local_20;
  local_30 = in_RSI;
  bitmask<slang::ast::VariableFlags>::bitmask(&local_52,Const);
  bVar1 = bitmask<slang::ast::VariableFlags>::has
                    ((bitmask<slang::ast::VariableFlags> *)
                     CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
                     (bitmask<slang::ast::VariableFlags> *)
                     CONCAT26(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff28));
  if (bVar1) {
    this = not_null<const_slang::ast::Scope_*>::operator->
                     ((not_null<const_slang::ast::Scope_*> *)0xa1d145);
    local_60 = Scope::asSymbol(this);
    while (local_60->kind == StatementBlock) {
      local_68 = Symbol::getParentScope(local_60);
      local_60 = Scope::asSymbol(local_68);
    }
    pEVar2 = ValueSymbol::getInitializer((ValueSymbol *)0xa1d18b);
    local_a9 = true;
    if ((pEVar2 == (Expression *)0x0) && (local_a9 = true, local_60->kind == Subroutine)) {
      Symbol::as<slang::ast::SubroutineSymbol>((Symbol *)0xa1d1b4);
      bitmask<slang::ast::MethodFlags>::bitmask(&local_6c,Constructor);
      local_6a = (underlying_type)
                 bitmask<slang::ast::MethodFlags>::operator&
                           (in_stack_ffffffffffffff38,
                            (bitmask<slang::ast::MethodFlags> *)
                            CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
      local_a9 = bitmask<slang::ast::MethodFlags>::operator==
                           ((bitmask<slang::ast::MethodFlags> *)
                            CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
                            in_stack_ffffffffffffff2e);
    }
    if (local_a9 != false) {
      local_70 = 0x180007;
      code.code = in_stack_ffffffffffffff86;
      code.subsystem = in_stack_ffffffffffffff84;
      bVar1 = checkVariableAssignment::anon_class_32_4_231050bc::operator()
                        ((anon_class_32_4_231050bc *)
                         CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),code);
      return bVar1;
    }
  }
  bitmask<slang::ast::VariableFlags>::bitmask(&local_72,CheckerFreeVariable);
  bVar1 = bitmask<slang::ast::VariableFlags>::has
                    ((bitmask<slang::ast::VariableFlags> *)
                     CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
                     (bitmask<slang::ast::VariableFlags> *)
                     CONCAT26(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff28));
  local_b9 = 0;
  if (bVar1) {
    bitmask<slang::ast::AssignFlags>::bitmask(&local_73,NonBlocking);
    bVar1 = bitmask<slang::ast::AssignFlags>::has
                      ((bitmask<slang::ast::AssignFlags> *)
                       CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
                       (bitmask<slang::ast::AssignFlags> *)
                       CONCAT26(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff28));
    local_b9 = bVar1 ^ 0xff;
  }
  if ((local_b9 & 1) == 0) {
    bitmask<slang::ast::AssignFlags>::bitmask
              ((bitmask<slang::ast::AssignFlags> *)&stack0xffffffffffffff87,NonBlocking);
    bVar1 = bitmask<slang::ast::AssignFlags>::has
                      ((bitmask<slang::ast::AssignFlags> *)
                       CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
                       (bitmask<slang::ast::AssignFlags> *)
                       CONCAT26(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff28));
    uVar3 = false;
    if ((bVar1) && (uVar3 = false, local_30[0x54] == 0)) {
      uVar3 = *local_30 != 0x3f;
    }
    if ((bool)uVar3 == false) {
      if (*local_30 == 0x53) {
        bitmask<slang::ast::AssignFlags>::bitmask(&local_7f,InConcat);
        bVar1 = bitmask<slang::ast::AssignFlags>::has
                          ((bitmask<slang::ast::AssignFlags> *)
                           CONCAT17(uVar3,in_stack_ffffffffffffff30),
                           (bitmask<slang::ast::AssignFlags> *)
                           CONCAT26(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff28));
        if (bVar1) {
          in_stack_ffffffffffffff7c = 0x3e0007;
          code_02.code = in_stack_ffffffffffffff86;
          code_02.subsystem = in_stack_ffffffffffffff84;
          checkVariableAssignment::anon_class_32_4_231050bc::operator()
                    ((anon_class_32_4_231050bc *)CONCAT44(0x3e0007,in_stack_ffffffffffffff78),
                     code_02);
        }
        local_90 = Symbol::as<slang::ast::ClockVarSymbol>((Symbol *)0xa1d3ad);
        if (local_90->direction == In) {
          local_94 = 0x520008;
          code_03.code = in_stack_ffffffffffffff86;
          code_03.subsystem = in_stack_ffffffffffffff84;
          bVar1 = checkVariableAssignment::anon_class_32_4_231050bc::operator()
                            ((anon_class_32_4_231050bc *)
                             CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),code_03);
          return bVar1;
        }
        bitmask<slang::ast::AssignFlags>::bitmask(&local_95,NonBlocking);
        bVar1 = bitmask<slang::ast::AssignFlags>::has
                          ((bitmask<slang::ast::AssignFlags> *)
                           CONCAT17(uVar3,in_stack_ffffffffffffff30),
                           (bitmask<slang::ast::AssignFlags> *)
                           CONCAT26(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff28));
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          local_9a = 0xb0008;
          code_04.code = in_stack_ffffffffffffff86;
          code_04.subsystem = in_stack_ffffffffffffff84;
          bVar1 = checkVariableAssignment::anon_class_32_4_231050bc::operator()
                            ((anon_class_32_4_231050bc *)
                             CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),code_04);
          return bVar1;
        }
      }
      bitmask<slang::ast::AssignFlags>::bitmask(&local_9b,InOutPort);
      bVar1 = bitmask<slang::ast::AssignFlags>::has
                        ((bitmask<slang::ast::AssignFlags> *)
                         CONCAT17(uVar3,in_stack_ffffffffffffff30),
                         (bitmask<slang::ast::AssignFlags> *)
                         CONCAT26(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff28));
      if (bVar1) {
        code_05.code = in_stack_ffffffffffffff86;
        code_05.subsystem = in_stack_ffffffffffffff84;
        local_1 = checkVariableAssignment::anon_class_32_4_231050bc::operator()
                            ((anon_class_32_4_231050bc *)
                             CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),code_05);
      }
      else {
        local_1 = true;
      }
    }
    else {
      local_7e = 7;
      code_01.code = in_stack_ffffffffffffff86;
      code_01.subsystem = 0x81;
      local_1 = checkVariableAssignment::anon_class_32_4_231050bc::operator()
                          ((anon_class_32_4_231050bc *)
                           CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),code_01);
    }
  }
  else {
    code_00.code = in_stack_ffffffffffffff86;
    code_00.subsystem = in_stack_ffffffffffffff84;
    local_1 = checkVariableAssignment::anon_class_32_4_231050bc::operator()
                        ((anon_class_32_4_231050bc *)
                         CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),code_00);
  }
  return local_1;
}

Assistant:

bool ValueExpressionBase::checkVariableAssignment(const ASTContext& context,
                                                  const VariableSymbol& var,
                                                  bitmask<AssignFlags> flags,
                                                  SourceLocation assignLoc, SourceRange varRange) {
    auto reportErr = [&](DiagCode code) {
        if (!assignLoc)
            assignLoc = varRange.start();

        auto& diag = context.addDiag(code, assignLoc);
        diag.addNote(diag::NoteDeclarationHere, var.location);
        diag << var.name << varRange;
        return false;
    };

    if (var.flags.has(VariableFlags::Const)) {
        // If we are in a class constructor and this variable does not have an initializer,
        // it's ok to assign to it.
        const Symbol* parent = &context.scope->asSymbol();
        while (parent->kind == SymbolKind::StatementBlock) {
            auto parentScope = parent->getParentScope();
            SLANG_ASSERT(parentScope);
            parent = &parentScope->asSymbol();
        }

        if (var.getInitializer() || parent->kind != SymbolKind::Subroutine ||
            (parent->as<SubroutineSymbol>().flags & MethodFlags::Constructor) == 0) {
            return reportErr(diag::AssignmentToConstVar);
        }
    }

    if (var.flags.has(VariableFlags::CheckerFreeVariable) && !flags.has(AssignFlags::NonBlocking))
        return reportErr(diag::BlockingAssignToFreeVar);

    if (flags.has(AssignFlags::NonBlocking) && var.lifetime == VariableLifetime::Automatic &&
        var.kind != SymbolKind::ClassProperty) {
        return reportErr(diag::NonblockingAssignmentToAuto);
    }

    if (var.kind == SymbolKind::ClockVar) {
        if (flags.has(AssignFlags::InConcat))
            reportErr(diag::ClockVarAssignConcat);

        auto& cv = var.as<ClockVarSymbol>();
        if (cv.direction == ArgumentDirection::In)
            return reportErr(diag::WriteToInputClockVar);

        if (!flags.has(AssignFlags::NonBlocking))
            return reportErr(diag::ClockVarSyncDrive);
    }

    if (flags.has(AssignFlags::InOutPort))
        return reportErr(diag::InOutVarPortConn);

    return true;
}